

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error asmjit::BaseBuilder_newLabelInternal(BaseBuilder *self,uint32_t labelId)

{
  ZoneVector<asmjit::LabelNode_*> *this;
  uint uVar1;
  CodeHolder *this_00;
  Error EVar2;
  Error extraout_EAX;
  Error extraout_EAX_00;
  Error EVar3;
  undefined8 *puVar4;
  size_t nameSize;
  char *name;
  uint n;
  undefined4 uVar5;
  BaseBuilder *self_00;
  ZoneVector<asmjit::LabelNode_*> *pZVar6;
  uint32_t in_R8D;
  uint32_t in_R9D;
  BaseBuilder *unaff_R14;
  LabelEntry *pLStack_58;
  ulong uStack_50;
  BaseBuilder *pBStack_48;
  ulong uStack_40;
  size_t sStack_38;
  
  uVar1 = (self->_labelNodes).super_ZoneVectorBase._size;
  n = labelId + 1;
  if (n <= uVar1) {
    uStack_40 = 0x11371b;
    BaseBuilder_newLabelInternal();
    EVar2 = extraout_EAX;
LAB_0011371b:
    EVar2 = BaseEmitter::reportError(&unaff_R14->super_BaseEmitter,EVar2,(char *)0x0);
    return EVar2;
  }
  this = &self->_labelNodes;
  self_00 = (BaseBuilder *)&self->_allocator;
  EVar2 = 0;
  if ((self->_labelNodes).super_ZoneVectorBase._capacity - uVar1 < labelId - uVar1) {
    uStack_40 = 0x11367a;
    EVar2 = ZoneVectorBase::_grow
                      (&this->super_ZoneVectorBase,(ZoneAllocator *)self_00,8,labelId - uVar1);
  }
  unaff_R14 = self;
  if (EVar2 != 0) goto LAB_0011371b;
  if (((ZoneAllocator *)self_00)->_zone == (Zone *)0x0) {
    uStack_40 = 0x11373a;
    BaseBuilder_newLabelInternal();
    EVar2 = extraout_EAX_00;
  }
  else {
    uStack_40 = 0x11369d;
    puVar4 = (undefined8 *)ZoneAllocator::_alloc((ZoneAllocator *)self_00,0x38,&sStack_38);
    EVar3 = 0;
    EVar2 = 0;
    if (puVar4 != (undefined8 *)0x0) {
      *puVar4 = 0;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 3;
      *(byte *)((long)puVar4 + 0x11) = (byte)self->_nodeFlags | 0x50;
      *(undefined8 *)((long)puVar4 + 0x12) = 0;
      *(undefined8 *)((long)puVar4 + 0x1a) = 0;
      puVar4[4] = 0;
      puVar4[5] = 0;
      *(uint32_t *)(puVar4 + 6) = labelId;
      goto LAB_001136d4;
    }
  }
  EVar3 = EVar2;
  puVar4 = (undefined8 *)0x0;
LAB_001136d4:
  if (puVar4 == (undefined8 *)0x0) {
    uStack_40 = 0x11374e;
    EVar3 = BaseEmitter::reportError(&self->super_BaseEmitter,1,(char *)0x0);
  }
  if (EVar3 == 0) {
    nameSize = (size_t)n;
    uStack_40 = 0x1136ef;
    pZVar6 = this;
    ZoneVectorBase::_resize(&this->super_ZoneVectorBase,(ZoneAllocator *)self_00,8,n);
    if ((self->_labelNodes).super_ZoneVectorBase._size <= labelId) {
      uStack_40 = 0x113755;
      BaseBuilder_newLabelInternal();
      this_00 = (self_00->super_BaseEmitter)._code;
      uVar5 = 0xffffffff;
      if (this_00 != (CodeHolder *)0x0) {
        uStack_50 = (ulong)labelId;
        pBStack_48 = self;
        uStack_40 = (ulong)n;
        EVar2 = CodeHolder::newNamedLabelEntry(this_00,&pLStack_58,name,nameSize,in_R8D,in_R9D);
        if (EVar2 == 0) {
          EVar2 = BaseBuilder_newLabelInternal(self_00,*(uint32_t *)&pLStack_58->field_0xc);
          if (EVar2 == 0) {
            uVar5 = *(undefined4 *)&pLStack_58->field_0xc;
          }
        }
      }
      *(undefined4 *)&(pZVar6->super_ZoneVectorBase)._data = 4;
      *(undefined4 *)((long)&(pZVar6->super_ZoneVectorBase)._data + 4) = uVar5;
      (pZVar6->super_ZoneVectorBase)._size = 0;
      (pZVar6->super_ZoneVectorBase)._capacity = 0;
      return (Error)pZVar6;
    }
    *(undefined8 **)((long)(this->super_ZoneVectorBase)._data + (ulong)labelId * 8) = puVar4;
    *(uint32_t *)(puVar4 + 6) = labelId;
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

static Error BaseBuilder_newLabelInternal(BaseBuilder* self, uint32_t labelId) {
  ASMJIT_ASSERT(self->_labelNodes.size() < labelId + 1);

  uint32_t growBy = labelId - self->_labelNodes.size();
  Error err = self->_labelNodes.willGrow(&self->_allocator, growBy);

  if (ASMJIT_UNLIKELY(err))
    return self->reportError(err);

  LabelNode* node;
  ASMJIT_PROPAGATE(self->_newNodeT<LabelNode>(&node, labelId));

  self->_labelNodes.resize(&self->_allocator, labelId + 1);
  self->_labelNodes[labelId] = node;
  node->_labelId = labelId;
  return kErrorOk;
}